

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int socket_server_listen(socket_server *ss,uintptr_t opaque,char *addr,int port,int backlog)

{
  undefined1 local_240 [4];
  int id;
  request_package request;
  int fd;
  int backlog_local;
  int port_local;
  char *addr_local;
  uintptr_t opaque_local;
  socket_server *ss_local;
  
  request.dummy._252_4_ = do_listen(addr,port,backlog);
  if ((int)request.dummy._252_4_ < 0) {
    ss_local._4_4_ = -1;
  }
  else {
    ss_local._4_4_ = reserve_id(ss);
    if (ss_local._4_4_ < 0) {
      close(request.dummy._252_4_);
    }
    else {
      request.header[4] = request.dummy[0xfc];
      request.header[5] = request.dummy[0xfd];
      request.header[6] = request.dummy[0xfe];
      request.header[7] = request.dummy[0xff];
      request.header._0_4_ = ss_local._4_4_;
      request.u._0_8_ = opaque;
      send_request(ss,(request_package *)local_240,'L',0x18);
    }
  }
  return ss_local._4_4_;
}

Assistant:

int 
socket_server_listen(struct socket_server *ss, uintptr_t opaque, const char * addr, int port, int backlog) {
	int fd = do_listen(addr, port, backlog);
	if (fd < 0) {
		return -1;
	}
	struct request_package request;
	int id = reserve_id(ss);
	if (id < 0) {
		close(fd);
		return id;
	}
	request.u.listen.opaque = opaque;
	request.u.listen.id = id;
	request.u.listen.fd = fd;
	send_request(ss, &request, 'L', sizeof(request.u.listen));
	return id;
}